

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::impl::anon_unknown_0::xml_buffered_writer::write_direct
          (xml_buffered_writer *this,char_t *data,size_t length)

{
  xml_encoding xVar1;
  size_t size;
  char_t *in_RDX;
  xml_buffered_writer *in_RSI;
  long in_RDI;
  size_t chunk_size;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  xml_encoding xVar2;
  
  flush((xml_buffered_writer *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if ((char_t *)0x800 < in_RDX) {
    xVar2 = *(xml_encoding *)(in_RDI + 0x2810);
    xVar1 = get_write_native_encoding();
    if (xVar2 == xVar1) {
      (**(code **)(**(long **)(in_RDI + 0x2800) + 0x10))(*(long **)(in_RDI + 0x2800),in_RSI,in_RDX);
      return;
    }
    for (; (char_t *)0x800 < in_RDX; in_RDX = in_RDX + -size) {
      size = get_valid_length(in_RSI->buffer,0x800);
      flush(in_RSI,in_RDX,size);
      in_RSI = (xml_buffered_writer *)(in_RSI->buffer + size);
    }
    *(undefined8 *)(in_RDI + 0x2808) = 0;
  }
  memcpy((void *)(in_RDI + *(long *)(in_RDI + 0x2808)),in_RSI,(size_t)in_RDX);
  *(char_t **)(in_RDI + 0x2808) = in_RDX + *(long *)(in_RDI + 0x2808);
  return;
}

Assistant:

void write_direct(const char_t* data, size_t length)
		{
			// flush the remaining buffer contents
			flush();

			// handle large chunks
			if (length > bufcapacity)
			{
				if (encoding == get_write_native_encoding())
				{
					// fast path, can just write data chunk
					writer.write(data, length * sizeof(char_t));
					return;
				}

				// need to convert in suitable chunks
				while (length > bufcapacity)
				{
					// get chunk size by selecting such number of characters that are guaranteed to fit into scratch buffer
					// and form a complete codepoint sequence (i.e. discard start of last codepoint if necessary)
					size_t chunk_size = get_valid_length(data, bufcapacity);
					assert(chunk_size);

					// convert chunk and write
					flush(data, chunk_size);

					// iterate
					data += chunk_size;
					length -= chunk_size;
				}

				// small tail is copied below
				bufsize = 0;
			}

			memcpy(buffer + bufsize, data, length * sizeof(char_t));
			bufsize += length;
		}